

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int monteCarloBiomes(Generator *g,Range r,uint64_t *rng,double coverage,double confidence,
                    _func_int_Generator_ptr_int_int_int_int_void_ptr *eval,void *data)

{
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  void *__ptr;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint64_t uVar14;
  int *piVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  uint local_dc;
  double local_80;
  
  if (r.sy == 0) {
    r.sy = 1;
  }
  uVar18 = (long)r.sy * (long)r.sx * (long)r.sz;
  dVar19 = inverf(confidence);
  dVar19 = dVar19 * 1.4142135623730951;
  auVar23._8_4_ = (int)(uVar18 >> 0x20);
  auVar23._0_8_ = uVar18;
  auVar23._12_4_ = 0x45300000;
  dVar20 = (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
  if (dVar20 < 0.0) {
    dVar25 = sqrt(dVar20);
  }
  else {
    dVar25 = SQRT(dVar20);
  }
  dVar25 = dVar25 * dVar19;
  dVar24 = (dVar19 * dVar19) / dVar25;
  dVar21 = ((1.0 - coverage) * coverage + dVar24 * 0.25) / dVar25;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  __ptr = (void *)0x0;
  if ((uVar18 < 0x7fffffff) && (dVar20 < dVar25 * 4.0)) {
    __ptr = malloc(uVar18 * 0xc);
  }
  if (0 < r.sy && __ptr != (void *)0x0) {
    lVar8 = 0;
    iVar10 = 0;
    do {
      if (0 < r.sz) {
        iVar16 = 0;
        do {
          if (0 < r.sx) {
            piVar15 = (int *)((long)__ptr + lVar8 * 0xc + 8);
            lVar13 = 0;
            do {
              piVar15[-2] = (int)lVar13;
              piVar15[-1] = iVar10;
              *piVar15 = iVar16;
              piVar15 = piVar15 + 3;
              lVar13 = lVar13 + 1;
            } while (r.sx != (int)lVar13);
            lVar8 = lVar8 + lVar13;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != r.sz);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != r.sy);
  }
  if (uVar18 == 0) {
    local_dc = 1;
  }
  else {
    dVar20 = 1.0 / (dVar24 + 1.0);
    dVar25 = (dVar24 * 0.5 + coverage) * dVar20;
    dVar20 = dVar19 * dVar20 * dVar21 + 1.1920928955078125e-07;
    uVar4 = r.sx - ((uint)r.sx >> 1 & 0x55555555);
    uVar5 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    uVar4 = r.sy - ((uint)r.sy >> 1 & 0x55555555);
    uVar12 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    uVar4 = r.sz - ((uint)r.sz >> 1 & 0x55555555);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    local_dc = 1;
    uVar17 = 0;
    dVar21 = 0.0;
    local_80 = 0.0;
    do {
      if (__ptr == (void *)0x0) {
        uVar14 = *rng;
        if (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar9 = uVar14 * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar9;
          iVar10 = (int)((uVar9 >> 0x11) * (long)r.sx >> 0x1f);
        }
        else {
          do {
            uVar14 = uVar14 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar10 = (int)((long)(uVar14 >> 0x11) % (long)r.sx);
          } while (-1 < iVar10 - ((int)(uVar14 >> 0x11) + r.sx));
          *rng = uVar14;
        }
        uVar9 = *rng;
        if (((uVar12 >> 4) + uVar12 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar9 = uVar9 * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar9;
          iVar16 = (int)((uVar9 >> 0x11) * (long)r.sy >> 0x1f);
        }
        else {
          do {
            uVar9 = uVar9 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar16 = (int)((long)(uVar9 >> 0x11) % (long)r.sy);
          } while (-1 < iVar16 - ((int)(uVar9 >> 0x11) + r.sy));
          *rng = uVar9;
        }
        uVar14 = *rng;
        if (((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar9 = uVar14 * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar9;
          iVar7 = (int)((uVar9 >> 0x11) * (long)r.sz >> 0x1f);
        }
        else {
          do {
            uVar14 = uVar14 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar7 = (int)((long)(uVar14 >> 0x11) % (long)r.sz);
          } while (-1 < iVar7 - ((int)(uVar14 >> 0x11) + r.sz));
          *rng = uVar14;
        }
      }
      else {
        uVar2 = (int)uVar18 - (int)uVar17;
        uVar11 = uVar2 - 1;
        if ((uVar2 & uVar11) == 0) {
          uVar9 = *rng * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar9;
          uVar6 = (uint)((uVar9 >> 0x11) * (long)(int)uVar2 >> 0x1f);
        }
        else {
          uVar14 = *rng;
          do {
            uVar14 = uVar14 * 0x5deece66d + 0xb & 0xffffffffffff;
            uVar6 = (uint)((long)(uVar14 >> 0x11) % (long)(int)uVar2);
          } while (-1 < (int)(uVar6 - ((int)(uVar14 >> 0x11) + uVar2)));
          *rng = uVar14;
        }
        lVar8 = (long)(int)uVar6;
        iVar10 = *(int *)((long)__ptr + lVar8 * 0xc);
        iVar16 = *(int *)((long)__ptr + lVar8 * 0xc + 4);
        iVar7 = *(int *)((long)__ptr + lVar8 * 0xc + 8);
        if (uVar6 != uVar11) {
          puVar1 = (undefined8 *)((long)__ptr + lVar8 * 0xc);
          lVar8 = (long)(int)uVar11;
          *(undefined4 *)(puVar1 + 1) = *(undefined4 *)((long)__ptr + lVar8 * 0xc + 8);
          *puVar1 = *(undefined8 *)((long)__ptr + lVar8 * 0xc);
          *(int *)((long)__ptr + lVar8 * 0xc) = iVar10;
          *(int *)((long)__ptr + lVar8 * 0xc + 4) = iVar16;
          *(int *)((long)__ptr + lVar8 * 0xc + 8) = iVar7;
        }
      }
      iVar10 = (*eval)(g,r.scale,iVar10 + r.x,iVar16 + r.y,iVar7 + r.z,data);
      if (iVar10 == -1) {
        bVar3 = false;
      }
      else if (iVar10 == 0) {
LAB_00111387:
        local_80 = local_80 + 1.0;
        dVar27 = 1.0 / local_80;
        dVar26 = dVar27 * dVar21;
        dVar29 = (dVar19 * dVar19) / local_80;
        dVar24 = ((1.0 - dVar26) * dVar26 + dVar29 * 0.25) / local_80;
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        dVar22 = 1.0 / (dVar29 + 1.0);
        dVar28 = (dVar29 * 0.5 + dVar26) * dVar22;
        dVar29 = dVar22 * dVar19 * dVar24 + 1.1920928955078125e-07;
        dVar24 = dVar28 - dVar29;
        bVar3 = true;
        if (dVar24 - dVar27 <= coverage) {
          dVar29 = dVar29 + dVar28;
          if (dVar27 + dVar29 < coverage) goto LAB_001114f5;
          if ((dVar20 + dVar25) - (dVar25 - dVar20) <= dVar29 - dVar24) {
            bVar3 = false;
          }
          else {
            local_dc = (uint)(coverage < dVar26);
          }
        }
        else {
          local_dc = 1;
        }
      }
      else {
        if (iVar10 == 1) {
          dVar21 = dVar21 + 1.0;
          goto LAB_00111387;
        }
LAB_001114f5:
        bVar3 = true;
        local_dc = 0;
      }
    } while ((!bVar3) && (uVar17 = uVar17 + 1, uVar17 != uVar18));
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return local_dc;
}

Assistant:

int monteCarloBiomes(
        Generator         * g,
        Range               r,
        uint64_t          * rng,
        double              coverage,
        double              confidence,
        int (*eval)(Generator *g, int scale, int x, int y, int z, void*),
        void              * data
        )
{
    if (r.sy == 0)
        r.sy = 1;

    struct touple { int x, y, z; } *buf = 0;
    size_t n = (size_t)r.sx*r.sy*r.sz;

    // z-score (i.e. probit, or standard deviations) for the confidence
    double zscore = sqrt(2.0) * inverf(confidence);

    // One standard deviation is approximately given by sqrt(n) elements,
    // hence we will take zscore * sqrt(n) as the maximum number of samples
    // to reach the desired confidence. This gives us a wilson score interval
    // for the upper and lower bound of successes we aim for.
    double wn = zscore * sqrt(n);
    double wlo, whi;
    wilson(wn, coverage, zscore, &wlo, &whi);

    // When the number of samples approaches the total number elements,
    // we can avoid repeated samples by shuffling a buffer.
    // (TODO: adjust for hypergeometric distribution?)
    if (n < 4 * wn && n < INT_MAX)
        buf = (struct touple*) malloc(n * sizeof(*buf));

    if (buf)
    {
        size_t idx = 0;
        int i, k, j;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    buf[idx].x = i;
                    buf[idx].y = k;
                    buf[idx].z = j;
                    idx++;
                }
            }
        }
    }

    size_t i = 0;
    double m = 0; // number of samples
    double x = 0; // number of successes
    int ret = 1;

    // iterate over the area in a random order
    for (i = 0; i < n; i++)
    {
        struct touple t;
        if (buf)
        {
            int j = n - i;
            int k = nextInt(rng, j);
            t = buf[k];
            if (k != j-1)
            {
                buf[k] = buf[j-1];
                buf[j-1] = t;
            }
        }
        else
        {
            t.x = nextInt(rng, r.sx);
            t.y = nextInt(rng, r.sy);
            t.z = nextInt(rng, r.sz);
        }

        int status = eval(g, r.scale, r.x+t.x, r.y+t.y, r.z+t.z, data);
        if (status == -1)
            continue;
        else if (status == 0)
            ;
        else if (status == 1)
            x += 1.0;
        else
        {
            ret = 0;
            break;
        }
        m += 1.0;

        // check if we can abort early with the current confidence interval
        double per_m = 1.0 / m;
        double lo, hi;
        wilson(m, x * per_m, zscore, &lo, &hi);

        if (lo - per_m > coverage)
        {
            ret = 1;
            break;
        }
        if (hi + per_m < coverage)
        {
            ret = 0;
            break;
        }

        if (hi - lo < whi - wlo)
        {   // should occur around i ~ wn
            ret = x * per_m > coverage;
            break;
        }
    }
    if (buf)
        free(buf);
    return ret;
}